

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O3

ParameterError parse_time_cond(GlobalConfig *global,OperationConfig *config,char *nextarg)

{
  char cVar1;
  int iVar2;
  long lVar3;
  long extraout_RAX;
  curl_off_t value;
  long local_20;
  
  cVar1 = *nextarg;
  if (cVar1 == '=') {
    config->timecond = 3;
  }
  else {
    if (cVar1 != '-') {
      if (cVar1 == '+') {
        nextarg = nextarg + 1;
      }
      config->timecond = 1;
      goto LAB_00112e8d;
    }
    config->timecond = 2;
  }
  nextarg = nextarg + 1;
LAB_00112e8d:
  lVar3 = curl_getdate(nextarg,0);
  config->condtime = lVar3;
  if (lVar3 == -1) {
    iVar2 = getfiletime(nextarg,global,&local_20);
    if (iVar2 == 0) {
      config->condtime = local_20;
      lVar3 = local_20;
    }
    else {
      config->timecond = 0;
      warnf(global,
            "Illegal date format for -z, --time-cond (and not a filename). Disabling time condition. See curl_getdate(3) for valid date syntax."
           );
      lVar3 = extraout_RAX;
    }
  }
  return (ParameterError)lVar3;
}

Assistant:

static ParameterError parse_time_cond(struct GlobalConfig *global,
                                      struct OperationConfig *config,
                                      const char *nextarg)
{
  ParameterError err = PARAM_OK;

  switch(*nextarg) {
  case '+':
    nextarg++;
    FALLTHROUGH();
  default:
    /* If-Modified-Since: (section 14.28 in RFC2068) */
    config->timecond = CURL_TIMECOND_IFMODSINCE;
    break;
  case '-':
    /* If-Unmodified-Since:  (section 14.24 in RFC2068) */
    config->timecond = CURL_TIMECOND_IFUNMODSINCE;
    nextarg++;
    break;
  case '=':
    /* Last-Modified:  (section 14.29 in RFC2068) */
    config->timecond = CURL_TIMECOND_LASTMOD;
    nextarg++;
    break;
  }
  config->condtime = (curl_off_t)curl_getdate(nextarg, NULL);
  if(-1 == config->condtime) {
    curl_off_t value;
    /* now let's see if it is a filename to get the time from instead! */
    int rc = getfiletime(nextarg, global, &value);
    if(!rc)
      /* pull the time out from the file */
      config->condtime = value;
    else {
      /* failed, remove time condition */
      config->timecond = CURL_TIMECOND_NONE;
      warnf(global,
            "Illegal date format for -z, --time-cond (and not "
            "a filename). Disabling time condition. "
            "See curl_getdate(3) for valid date syntax.");
    }
  }
  return err;
}